

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

void aes_encrypt(aes_context *ctx,uint8_t *input,uint8_t *output)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  aes_context *paVar12;
  uint uVar13;
  
  uVar5 = *(uint *)input;
  uVar1 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) ^
          ctx->key[0];
  uVar5 = *(uint *)(input + 4);
  uVar2 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) ^
          ctx->key[1];
  uVar5 = *(uint *)(input + 8);
  uVar7 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) ^
          ctx->key[2];
  uVar5 = *(uint *)(input + 0xc);
  uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) ^
          ctx->key[3];
  iVar3 = ctx->nr >> 1;
  iVar8 = iVar3 + -1;
  if (iVar8 == 0) {
    puVar4 = ctx->key + 4;
  }
  else {
    lVar9 = (long)iVar8;
    paVar12 = ctx;
    do {
      uVar6 = *(uint *)((long)TE + (ulong)(uVar2 >> 0xe & 0x3fc));
      uVar13 = (TE[uVar5 & 0xff] << 8 | TE[uVar5 & 0xff] >> 0x18) ^
               (TE[uVar7 >> 8 & 0xff] << 0x10 | TE[uVar7 >> 8 & 0xff] >> 0x10) ^
               (uVar6 << 0x18 | uVar6 >> 8) ^ TE[uVar1 >> 0x18] ^ paVar12->key[4];
      uVar6 = *(uint *)((long)TE + (ulong)(uVar7 >> 0xe & 0x3fc));
      uVar10 = (TE[uVar1 & 0xff] << 8 | TE[uVar1 & 0xff] >> 0x18) ^
               (TE[uVar5 >> 8 & 0xff] << 0x10 | TE[uVar5 >> 8 & 0xff] >> 0x10) ^
               (uVar6 << 0x18 | uVar6 >> 8) ^ TE[uVar2 >> 0x18] ^ paVar12->key[5];
      uVar6 = *(uint *)((long)TE + (ulong)(uVar5 >> 0xe & 0x3fc));
      uVar11 = (TE[uVar2 & 0xff] << 8 | TE[uVar2 & 0xff] >> 0x18) ^
               (TE[uVar1 >> 8 & 0xff] << 0x10 | TE[uVar1 >> 8 & 0xff] >> 0x10) ^
               (uVar6 << 0x18 | uVar6 >> 8) ^ TE[uVar7 >> 0x18] ^ paVar12->key[6];
      uVar1 = *(uint *)((long)TE + (ulong)(uVar1 >> 0xe & 0x3fc));
      uVar6 = (TE[uVar7 & 0xff] << 8 | TE[uVar7 & 0xff] >> 0x18) ^
              (TE[uVar2 >> 8 & 0xff] << 0x10 | TE[uVar2 >> 8 & 0xff] >> 0x10) ^
              (uVar1 << 0x18 | uVar1 >> 8) ^ TE[uVar5 >> 0x18] ^ paVar12->key[7];
      uVar5 = *(uint *)((long)TE + (ulong)(uVar10 >> 0xe & 0x3fc));
      uVar1 = (TE[uVar6 & 0xff] << 8 | TE[uVar6 & 0xff] >> 0x18) ^
              (TE[uVar11 >> 8 & 0xff] << 0x10 | TE[uVar11 >> 8 & 0xff] >> 0x10) ^
              (uVar5 << 0x18 | uVar5 >> 8) ^ TE[uVar13 >> 0x18] ^ paVar12->key[8];
      uVar5 = *(uint *)((long)TE + (ulong)(uVar11 >> 0xe & 0x3fc));
      uVar2 = (TE[uVar13 & 0xff] << 8 | TE[uVar13 & 0xff] >> 0x18) ^
              (TE[uVar6 >> 8 & 0xff] << 0x10 | TE[uVar6 >> 8 & 0xff] >> 0x10) ^
              (uVar5 << 0x18 | uVar5 >> 8) ^ TE[uVar10 >> 0x18] ^ paVar12->key[9];
      uVar5 = *(uint *)((long)TE + (ulong)(uVar6 >> 0xe & 0x3fc));
      uVar7 = (TE[uVar10 & 0xff] << 8 | TE[uVar10 & 0xff] >> 0x18) ^
              (TE[uVar13 >> 8 & 0xff] << 0x10 | TE[uVar13 >> 8 & 0xff] >> 0x10) ^
              (uVar5 << 0x18 | uVar5 >> 8) ^ TE[uVar11 >> 0x18] ^ paVar12->key[10];
      uVar5 = *(uint *)((long)TE + (ulong)(uVar13 >> 0xe & 0x3fc));
      uVar5 = (TE[uVar11 & 0xff] << 8 | TE[uVar11 & 0xff] >> 0x18) ^
              (TE[uVar10 >> 8 & 0xff] << 0x10 | TE[uVar10 >> 8 & 0xff] >> 0x10) ^
              (uVar5 << 0x18 | uVar5 >> 8) ^ TE[uVar6 >> 0x18] ^ paVar12->key[0xb];
      paVar12 = (aes_context *)(paVar12->key + 4);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    puVar4 = ctx->key + (long)iVar3 * 8 + -4;
    ctx = paVar12;
  }
  uVar6 = *(uint *)((long)TE + (ulong)(uVar2 >> 0xe & 0x3fc));
  uVar10 = (TE[uVar5 & 0xff] << 8 | TE[uVar5 & 0xff] >> 0x18) ^
           (TE[uVar7 >> 8 & 0xff] << 0x10 | TE[uVar7 >> 8 & 0xff] >> 0x10) ^
           (uVar6 << 0x18 | uVar6 >> 8) ^ TE[uVar1 >> 0x18] ^ *puVar4;
  uVar6 = *(uint *)((long)TE + (ulong)(uVar7 >> 0xe & 0x3fc));
  uVar11 = (TE[uVar1 & 0xff] << 8 | TE[uVar1 & 0xff] >> 0x18) ^
           (TE[uVar5 >> 8 & 0xff] << 0x10 | TE[uVar5 >> 8 & 0xff] >> 0x10) ^
           (uVar6 << 0x18 | uVar6 >> 8) ^ TE[uVar2 >> 0x18] ^ ctx->key[5];
  uVar6 = *(uint *)((long)TE + (ulong)(uVar5 >> 0xe & 0x3fc));
  uVar6 = (TE[uVar2 & 0xff] << 8 | TE[uVar2 & 0xff] >> 0x18) ^
          (TE[uVar1 >> 8 & 0xff] << 0x10 | TE[uVar1 >> 8 & 0xff] >> 0x10) ^
          (uVar6 << 0x18 | uVar6 >> 8) ^ TE[uVar7 >> 0x18] ^ ctx->key[6];
  uVar1 = *(uint *)((long)TE + (ulong)(uVar1 >> 0xe & 0x3fc));
  uVar7 = (TE[uVar7 & 0xff] << 8 | TE[uVar7 & 0xff] >> 0x18) ^
          (TE[uVar2 >> 8 & 0xff] << 0x10 | TE[uVar2 >> 8 & 0xff] >> 0x10) ^
          (uVar1 << 0x18 | uVar1 >> 8) ^ TE[uVar5 >> 0x18] ^ ctx->key[7];
  uVar2 = ((uint)Te[uVar7 & 0xff] |
          (uint)Te[uVar6 >> 8 & 0xff] << 8 |
          (uint)Te[uVar11 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar10 >> 0x18] << 0x18) ^ ctx->key[8];
  uVar1 = ((uint)Te[uVar10 & 0xff] |
          (uint)Te[uVar7 >> 8 & 0xff] << 8 |
          (uint)Te[uVar6 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar11 >> 0x18] << 0x18) ^ ctx->key[9];
  uVar5 = ((uint)Te[uVar11 & 0xff] |
          (uint)Te[uVar10 >> 8 & 0xff] << 8 |
          (uint)Te[uVar7 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar6 >> 0x18] << 0x18) ^ ctx->key[10];
  uVar7 = ((uint)Te[uVar6 & 0xff] |
          (uint)Te[uVar11 >> 8 & 0xff] << 8 |
          (uint)Te[uVar10 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar7 >> 0x18] << 0x18) ^ ctx->key[0xb]
  ;
  *output = (uint8_t)(uVar2 >> 0x18);
  output[1] = (uint8_t)(uVar2 >> 0x10);
  output[2] = (uint8_t)(uVar2 >> 8);
  output[3] = (uint8_t)uVar2;
  output[4] = (uint8_t)(uVar1 >> 0x18);
  output[5] = (uint8_t)(uVar1 >> 0x10);
  output[6] = (uint8_t)(uVar1 >> 8);
  output[7] = (uint8_t)uVar1;
  output[8] = (uint8_t)(uVar5 >> 0x18);
  output[9] = (uint8_t)(uVar5 >> 0x10);
  output[10] = (uint8_t)(uVar5 >> 8);
  output[0xb] = (uint8_t)uVar5;
  output[0xc] = (uint8_t)(uVar7 >> 0x18);
  output[0xd] = (uint8_t)(uVar7 >> 0x10);
  output[0xe] = (uint8_t)(uVar7 >> 8);
  output[0xf] = (uint8_t)uVar7;
  return;
}

Assistant:

static void aes_encrypt(const aes_context* ctx, const uint8_t* input, uint8_t* output)
{
    uint32_t t0, t1, t2, t3;
    const uint32_t* key = ctx->key;

    uint32_t s0 = get32be(input + 0) ^ *key++;
    uint32_t s1 = get32be(input + 4) ^ *key++;
    uint32_t s2 = get32be(input + 8) ^ *key++;
    uint32_t s3 = get32be(input + 12) ^ *key++;

    for (size_t i = (ctx->nr>>1)-1; i > 0; i--)
    {
        t0 = TE[byte32(s0, 3)] ^ ror32(TE[byte32(s1, 2)], 8) ^ ror32(TE[byte32(s2, 1)], 16) ^ ror32(TE[byte32(s3, 0)], 24) ^ *key++;
        t1 = TE[byte32(s1, 3)] ^ ror32(TE[byte32(s2, 2)], 8) ^ ror32(TE[byte32(s3, 1)], 16) ^ ror32(TE[byte32(s0, 0)], 24) ^ *key++;
        t2 = TE[byte32(s2, 3)] ^ ror32(TE[byte32(s3, 2)], 8) ^ ror32(TE[byte32(s0, 1)], 16) ^ ror32(TE[byte32(s1, 0)], 24) ^ *key++;
        t3 = TE[byte32(s3, 3)] ^ ror32(TE[byte32(s0, 2)], 8) ^ ror32(TE[byte32(s1, 1)], 16) ^ ror32(TE[byte32(s2, 0)], 24) ^ *key++;

        s0 = TE[byte32(t0, 3)] ^ ror32(TE[byte32(t1, 2)], 8) ^ ror32(TE[byte32(t2, 1)], 16) ^ ror32(TE[byte32(t3, 0)], 24) ^ *key++;
        s1 = TE[byte32(t1, 3)] ^ ror32(TE[byte32(t2, 2)], 8) ^ ror32(TE[byte32(t3, 1)], 16) ^ ror32(TE[byte32(t0, 0)], 24) ^ *key++;
        s2 = TE[byte32(t2, 3)] ^ ror32(TE[byte32(t3, 2)], 8) ^ ror32(TE[byte32(t0, 1)], 16) ^ ror32(TE[byte32(t1, 0)], 24) ^ *key++;
        s3 = TE[byte32(t3, 3)] ^ ror32(TE[byte32(t0, 2)], 8) ^ ror32(TE[byte32(t1, 1)], 16) ^ ror32(TE[byte32(t2, 0)], 24) ^ *key++;
    }

    t0 = TE[byte32(s0, 3)] ^ ror32(TE[byte32(s1, 2)], 8) ^ ror32(TE[byte32(s2, 1)], 16) ^ ror32(TE[byte32(s3, 0)], 24) ^ *key++;
    t1 = TE[byte32(s1, 3)] ^ ror32(TE[byte32(s2, 2)], 8) ^ ror32(TE[byte32(s3, 1)], 16) ^ ror32(TE[byte32(s0, 0)], 24) ^ *key++;
    t2 = TE[byte32(s2, 3)] ^ ror32(TE[byte32(s3, 2)], 8) ^ ror32(TE[byte32(s0, 1)], 16) ^ ror32(TE[byte32(s1, 0)], 24) ^ *key++;
    t3 = TE[byte32(s3, 3)] ^ ror32(TE[byte32(s0, 2)], 8) ^ ror32(TE[byte32(s1, 1)], 16) ^ ror32(TE[byte32(s2, 0)], 24) ^ *key++;

    s0 = (Te[byte32(t0, 3)] << 24) ^ (Te[byte32(t1, 2)] << 16) ^ (Te[byte32(t2, 1)] << 8) ^ Te[byte32(t3, 0)] ^ *key++;
    s1 = (Te[byte32(t1, 3)] << 24) ^ (Te[byte32(t2, 2)] << 16) ^ (Te[byte32(t3, 1)] << 8) ^ Te[byte32(t0, 0)] ^ *key++;
    s2 = (Te[byte32(t2, 3)] << 24) ^ (Te[byte32(t3, 2)] << 16) ^ (Te[byte32(t0, 1)] << 8) ^ Te[byte32(t1, 0)] ^ *key++;
    s3 = (Te[byte32(t3, 3)] << 24) ^ (Te[byte32(t0, 2)] << 16) ^ (Te[byte32(t1, 1)] << 8) ^ Te[byte32(t2, 0)] ^ *key++;

    set32be(output + 0, s0);
    set32be(output + 4, s1);
    set32be(output + 8, s2);
    set32be(output + 12, s3);
}